

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O0

StatementSyntax * __thiscall
slang::parsing::Parser::parseDisableStatement
          (Parser *this,NamedLabelSyntax *label,AttrList attributes)

{
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements;
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements_00;
  Token disable_00;
  Token fork_00;
  Token semi;
  Token semi_00;
  bool bVar1;
  NameSyntax *pNVar2;
  Info *pIVar3;
  long in_RDI;
  Token TVar4;
  NameSyntax *name;
  Token fork;
  Token disable;
  Parser *in_stack_fffffffffffffe80;
  undefined6 in_stack_fffffffffffffe88;
  TokenKind in_stack_fffffffffffffe8e;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffe90;
  undefined8 in_stack_fffffffffffffe98;
  ParserBase *in_stack_fffffffffffffea0;
  Info *in_stack_fffffffffffffea8;
  undefined8 in_stack_fffffffffffffeb0;
  Info *in_stack_fffffffffffffeb8;
  undefined8 local_130;
  undefined8 local_128;
  TokenKind in_stack_ffffffffffffff0e;
  ParserBase *in_stack_ffffffffffffff10;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_8;
  
  ParserBase::consume(in_stack_fffffffffffffea0);
  bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffe90._M_extent_value,
                           in_stack_fffffffffffffe8e);
  if (bVar1) {
    TVar4 = ParserBase::consume(in_stack_fffffffffffffea0);
    pIVar3 = (Info *)(in_RDI + 0xe0);
    elements._M_ptr._6_2_ = in_stack_fffffffffffffe8e;
    elements._M_ptr._0_6_ = in_stack_fffffffffffffe88;
    elements._M_extent._M_extent_value = in_stack_fffffffffffffe90._M_extent_value;
    slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
              ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_fffffffffffffe80,
               elements);
    local_48 = TVar4._0_8_;
    local_40 = TVar4.info;
    TVar4 = ParserBase::expect(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0e);
    fork_00.info = in_stack_fffffffffffffea8;
    fork_00._0_8_ = in_stack_fffffffffffffea0;
    semi.info = pIVar3;
    semi.kind = (short)in_stack_fffffffffffffeb0;
    semi._2_1_ = (char)((ulong)in_stack_fffffffffffffeb0 >> 0x10);
    semi.numFlags.raw = (char)((ulong)in_stack_fffffffffffffeb0 >> 0x18);
    semi.rawLen = (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
    local_8 = slang::syntax::SyntaxFactory::disableForkStatement
                        ((SyntaxFactory *)local_40,local_48,
                         (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)0x33014f,TVar4,
                         fork_00,semi);
  }
  else {
    pNVar2 = parseName(in_stack_fffffffffffffe80);
    pIVar3 = (Info *)(in_RDI + 0xe0);
    elements_00._M_ptr._6_2_ = in_stack_fffffffffffffe8e;
    elements_00._M_ptr._0_6_ = in_stack_fffffffffffffe88;
    elements_00._M_extent._M_extent_value = in_stack_fffffffffffffe90._M_extent_value;
    slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
              ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_fffffffffffffe80,
               elements_00);
    TVar4 = ParserBase::expect(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0e);
    local_130 = TVar4._0_8_;
    local_128 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)TVar4.info;
    disable_00.info = pIVar3;
    disable_00.kind = (short)in_stack_fffffffffffffe98;
    disable_00._2_1_ = (char)((ulong)in_stack_fffffffffffffe98 >> 0x10);
    disable_00.numFlags.raw = (char)((ulong)in_stack_fffffffffffffe98 >> 0x18);
    disable_00.rawLen = (int)((ulong)in_stack_fffffffffffffe98 >> 0x20);
    semi_00.info = in_stack_fffffffffffffeb8;
    semi_00._0_8_ = pNVar2;
    local_8 = (DisableForkStatementSyntax *)
              slang::syntax::SyntaxFactory::disableStatement
                        ((SyntaxFactory *)in_stack_fffffffffffffe90._M_extent_value,
                         (NamedLabelSyntax *)
                         CONCAT26(in_stack_fffffffffffffe8e,in_stack_fffffffffffffe88),local_128,
                         disable_00,local_130,semi_00);
  }
  return &local_8->super_StatementSyntax;
}

Assistant:

StatementSyntax& Parser::parseDisableStatement(NamedLabelSyntax* label, AttrList attributes) {
    auto disable = consume();
    if (peek(TokenKind::ForkKeyword)) {
        auto fork = consume();
        return factory.disableForkStatement(label, attributes, disable, fork,
                                            expect(TokenKind::Semicolon));
    }

    auto& name = parseName();
    return factory.disableStatement(label, attributes, disable, name, expect(TokenKind::Semicolon));
}